

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitfield.h
# Opt level: O2

bool __thiscall
ClownLZSS::Internal::BitField::
Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
::Pop(Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
      *this)

{
  ulong uVar1;
  anon_class_8_1_8991fb9c local_10;
  
  local_10.this = this;
  Pop::anon_class_8_1_8991fb9c::operator()(&local_10);
  uVar1 = this->bits;
  this->bits = uVar1 >> 1;
  this->bits_remaining = this->bits_remaining - 1;
  return (bool)((byte)uVar1 & 1);
}

Assistant:

bool Pop()
				{
					const auto &CheckReadBits = [&]()
					{
						if (bits_remaining == 0)
							ReadBits();
					};

					if constexpr(read_when == ReadWhen::BeforePop)
						CheckReadBits();

					constexpr unsigned int mask = []() constexpr
					{
						if constexpr(pop_where == PopWhere::High)
							return 1 << (total_bits - 1);
						else if constexpr(pop_where == PopWhere::Low)
							return 1;
					}();

					const bool bit = (bits & mask) != 0;

					if constexpr(pop_where == PopWhere::High)
						bits <<= 1;
					else if constexpr(pop_where == PopWhere::Low)
						bits >>= 1;

					--bits_remaining;

					if constexpr(read_when == ReadWhen::AfterPop)
						CheckReadBits();

					return bit;
				}